

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O0

int __thiscall CLineInput::OffsetFromDisplayToActual(CLineInput *this,int DisplayOffset)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  CLineInput *in_RDI;
  int PrevOffset;
  int i;
  int ActualOffset;
  int local_1c;
  int local_18;
  int local_4;
  
  bVar1 = IsHidden(in_RDI);
  local_4 = in_ESI;
  if (bVar1) {
    local_18 = 0;
    local_1c = 0;
    while ((local_1c < in_ESI &&
           (iVar2 = str_utf8_forward(in_RDI->m_pStr,local_18), bVar1 = iVar2 != local_18,
           local_18 = iVar2, bVar1))) {
      local_1c = local_1c + 1;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int CLineInput::OffsetFromDisplayToActual(int DisplayOffset) const
{
	if(!IsHidden())
		return DisplayOffset;
	int ActualOffset = 0;
	for(int i = 0; i < DisplayOffset; i++)
	{
		const int PrevOffset = ActualOffset;
		ActualOffset = str_utf8_forward(m_pStr, ActualOffset);
		if(ActualOffset == PrevOffset)
			break;
	}
	return ActualOffset;
}